

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorDatabase::FindAllPackageNames
          (DescriptorDatabase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  int iVar1;
  LogMessage *pLVar2;
  string *value;
  bool bVar3;
  undefined1 local_1a8 [8];
  FileDescriptorProto file_proto;
  undefined1 local_98 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_names;
  LogFinisher local_31;
  
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = (*this->_vptr_DescriptorDatabase[6])();
  if ((char)iVar1 == '\0') {
    bVar3 = false;
  }
  else {
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&set;
    set._M_t._M_impl._0_4_ = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1a8,(Arena *)0x0);
    bVar3 = set._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    if (!bVar3) {
      bVar3 = false;
      value = (string *)set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        FileDescriptorProto::Clear((FileDescriptorProto *)local_1a8);
        iVar1 = (*this->_vptr_DescriptorDatabase[2])(this,value,local_1a8);
        if ((char)iVar1 == '\0') {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&file_proto.source_code_info_,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor_database.cc"
                     ,0x51);
          pLVar2 = internal::LogMessage::operator<<
                             ((LogMessage *)&file_proto.source_code_info_,
                              "File not found in database (unexpected): ");
          pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
          internal::LogFinisher::operator=(&local_31,pLVar2);
          internal::LogMessage::~LogMessage((LogMessage *)&file_proto.source_code_info_);
          goto LAB_002b36db;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_98,file_proto.name_.ptr_);
        value = value + 1;
        bVar3 = value == (string *)0x0;
      } while (!bVar3);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output,
               (output->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,&set);
LAB_002b36db:
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return bVar3;
}

Assistant:

bool DescriptorDatabase::FindAllPackageNames(std::vector<std::string>* output) {
  return ForAllFileProtos(
      this,
      [](const FileDescriptorProto& file_proto, std::set<std::string>* set) {
        set->insert(file_proto.package());
      },
      output);
}